

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

CompressionParameters * __thiscall
kj::_::NullableValue<kj::CompressionParameters>::emplace<kj::CompressionParameters&>
          (NullableValue<kj::CompressionParameters> *this,CompressionParameters *params)

{
  if (this->isSet == true) {
    this->isSet = false;
  }
  CompressionParameters::CompressionParameters(&(this->field_1).value,params);
  this->isSet = true;
  return (CompressionParameters *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }